

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile_helpers.hpp
# Opt level: O1

void __thiscall duckdb::QuantileValue::QuantileValue(QuantileValue *this,Value *v)

{
  double dVar1;
  int64_t iVar2;
  byte bVar3;
  hugeint_t hVar4;
  
  duckdb::Value::Value(&this->val,v);
  dVar1 = duckdb::Value::GetValue<double>();
  this->dbl = dVar1;
  if (this->val == (Value)0x15) {
    hVar4 = (hugeint_t)duckdb::IntegralValue::Get(v);
    this->integral = hVar4;
    bVar3 = duckdb::DecimalType::GetScale((LogicalType *)this);
    iVar2 = *(int64_t *)(duckdb::hugeint_t::operator&= + (ulong)bVar3 * 0x10);
    (this->scaling).lower = (&Hugeint::POWERS_OF_TEN)[(ulong)bVar3 * 2];
    (this->scaling).upper = iVar2;
  }
  return;
}

Assistant:

explicit QuantileValue(const Value &v) : val(v), dbl(v.GetValue<double>()) {
		const auto &type = val.type();
		switch (type.id()) {
		case LogicalTypeId::DECIMAL: {
			integral = IntegralValue::Get(v);
			scaling = Hugeint::POWERS_OF_TEN[DecimalType::GetScale(type)];
			break;
		}
		default:
			break;
		}
	}